

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  XmlWriter *pXVar3;
  pointer pMVar4;
  pointer pcVar5;
  XmlReporter *this_00;
  int iVar6;
  OfType OVar7;
  undefined8 in_RCX;
  char cVar8;
  MessageInfo *msg;
  pointer pMVar9;
  AssertionStats *pAVar10;
  ScopedElement scoped;
  ScopedElement scoped_2;
  string local_c0;
  undefined4 local_9c;
  undefined1 local_98 [32];
  AssertionStats *local_78;
  string local_70;
  XmlReporter *local_50;
  StringRef local_48;
  
  iVar6 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_9c = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (((char)iVar6 == '\0') &&
     ((OVar7 = (assertionStats->assertionResult).m_resultData.resultType, (OVar7 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar7 != Warning) {
      return true;
    }
    local_9c = 0;
  }
  pMVar9 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78 = assertionStats;
  local_50 = this;
  if (pMVar9 != pMVar4) {
    paVar2 = &local_c0.field_2;
    pXVar1 = &this->m_xml;
    cVar8 = (char)local_9c;
    do {
      if (pMVar9->type == Info && cVar8 == '\x01') {
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Info","");
        local_98._0_8_ = pXVar1;
        XmlWriter::startElement(pXVar1,&local_c0);
        XmlWriter::writeText(pXVar1,&pMVar9->message,true);
LAB_001303ae:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != paVar2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      else if (pMVar9->type == Warning) {
        local_c0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Warning","");
        local_98._0_8_ = pXVar1;
        XmlWriter::startElement(pXVar1,&local_c0);
        XmlWriter::writeText(pXVar1,&pMVar9->message,true);
        goto LAB_001303ae;
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar4);
  }
  this_00 = local_50;
  pAVar10 = local_78;
  OVar7 = (local_78->assertionResult).m_resultData.resultType;
  if ((byte)((byte)local_9c | OVar7 == Warning) != 1) {
    return true;
  }
  if (*(local_78->assertionResult).m_info.capturedExpression.m_start != '\0') {
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Expression","");
    pXVar1 = &this_00->m_xml;
    XmlWriter::startElement(pXVar1,&local_c0);
    pXVar3 = (XmlWriter *)(local_98 + 0x10);
    local_98._0_8_ = pXVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"success","");
    XmlWriter::writeAttribute
              (pXVar1,(string *)local_98,
               ((pAVar10->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"type","");
    local_48.m_start = (local_78->assertionResult).m_info.macroName.m_start;
    local_48.m_size = (local_78->assertionResult).m_info.macroName.m_size;
    local_48.m_data = (char *)0x0;
    XmlWriter::writeAttribute<Catch::StringRef>(pXVar1,&local_70,&local_48);
    if (local_48.m_data != (char *)0x0) {
      operator_delete__(local_48.m_data);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pAVar10 = local_78;
    if ((XmlWriter *)local_98._0_8_ != pXVar3) {
      operator_delete((void *)local_98._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pAVar10->assertionResult).m_info.lineInfo.file;
    local_c0._M_string_length = (pAVar10->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_c0);
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Original","");
    local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_c0);
    AssertionResult::getExpression_abi_cxx11_((string *)local_98,&pAVar10->assertionResult);
    XmlWriter::writeText(pXVar1,(string *)local_98,true);
    if ((XmlWriter *)local_98._0_8_ != pXVar3) {
      operator_delete((void *)local_98._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Expanded","");
    local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_c0);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_98,&pAVar10->assertionResult);
    XmlWriter::writeText(pXVar1,(string *)local_98,true);
    if ((XmlWriter *)local_98._0_8_ != pXVar3) {
      operator_delete((void *)local_98._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    OVar7 = (pAVar10->assertionResult).m_resultData.resultType;
  }
  if (OVar7 < ThrewException) {
    if (OVar7 == Info) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Info","");
      pXVar1 = &this_00->m_xml;
      local_70._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
      XmlWriter::startElement(pXVar1,&local_c0);
      pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_98._0_8_ = (XmlWriter *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar5,
                 pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText(pXVar1,(string *)local_98,true);
      if ((XmlWriter *)local_98._0_8_ != (XmlWriter *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      goto LAB_001308a0;
    }
    if (OVar7 != ExplicitFailure) goto LAB_001308a0;
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Failure","");
    XmlWriter::startElement(&this_00->m_xml,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pAVar10->assertionResult).m_info.lineInfo.file;
    local_c0._M_string_length = (pAVar10->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_c0);
    pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_c0,true);
  }
  else if (OVar7 == FatalErrorCondition) {
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"FatalErrorCondition","");
    XmlWriter::startElement(&this_00->m_xml,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pAVar10->assertionResult).m_info.lineInfo.file;
    local_c0._M_string_length = (pAVar10->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_c0);
    pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_c0,true);
  }
  else {
    if (OVar7 != ThrewException) goto LAB_001308a0;
    paVar2 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Exception","");
    XmlWriter::startElement(&this_00->m_xml,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    local_c0._M_dataplus._M_p = (pAVar10->assertionResult).m_info.lineInfo.file;
    local_c0._M_string_length = (pAVar10->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_00,(SourceLineInfo *)&local_c0);
    pcVar5 = (pAVar10->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar5,
               pcVar5 + (pAVar10->assertionResult).m_resultData.message._M_string_length);
    XmlWriter::writeText(&this_00->m_xml,&local_c0,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  XmlWriter::endElement(&this_00->m_xml);
LAB_001308a0:
  if (*(pAVar10->assertionResult).m_info.capturedExpression.m_start != '\0') {
    XmlWriter::endElement(&this_00->m_xml);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }